

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::ContainerPrinter::
     PrintValue<std::forward_list<bool,std::allocator<bool>>,void>
               (forward_list<bool,_std::allocator<bool>_> *container,ostream *os)

{
  bool bVar1;
  reference value;
  bool *elem;
  const_iterator __end0;
  const_iterator __begin0;
  forward_list<bool,_std::allocator<bool>_> *__range3;
  size_t count;
  size_t kMaxCount;
  ostream *os_local;
  forward_list<bool,_std::allocator<bool>_> *container_local;
  
  std::operator<<(os,'{');
  __range3 = (forward_list<bool,_std::allocator<bool>_> *)0x0;
  __end0 = std::forward_list<bool,_std::allocator<bool>_>::begin(container);
  elem = (bool *)std::forward_list<bool,_std::allocator<bool>_>::end(container);
  do {
    bVar1 = std::operator==(&__end0,(_Self *)&elem);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_002bf567:
      if (__range3 != (forward_list<bool,_std::allocator<bool>_> *)0x0) {
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    value = std::_Fwd_list_const_iterator<bool>::operator*(&__end0);
    if ((__range3 != (forward_list<bool,_std::allocator<bool>_> *)0x0) &&
       (std::operator<<(os,','), __range3 == (forward_list<bool,_std::allocator<bool>_> *)0x20)) {
      std::operator<<(os," ...");
      goto LAB_002bf567;
    }
    std::operator<<(os,' ');
    UniversalPrint<bool>(value,os);
    __range3 = (forward_list<bool,_std::allocator<bool>_> *)
               ((long)&(__range3->super__Fwd_list_base<bool,_std::allocator<bool>_>)._M_impl._M_head
                       ._M_next + 1);
    std::_Fwd_list_const_iterator<bool>::operator++(&__end0);
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }